

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heapmap.cpp
# Opt level: O1

void test2(void)

{
  bool bVar1;
  HeapMap<LinkedNode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
  *this;
  LinkedNode *k;
  char *__end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  int local_34;
  
  this = TinyGC::
         MakeGarbageCollected<HeapMap<LinkedNode,std::__cxx11::string,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>
                   (tg);
  local_34 = 0;
  do {
    local_58._M_dataplus._M_p = (pointer)0x0;
    k = TinyGC::MakeGarbageCollected<LinkedNode,decltype(nullptr),int&>
                  (tg,(void **)&local_58,&local_34);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"122","");
    HeapMap<LinkedNode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
    ::insert(this,k,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    bVar1 = local_34 < 9;
    local_34 = local_34 + 1;
  } while (bVar1);
  return;
}

Assistant:

void test2() {
  HeapMap<LinkedNode, std::string> *p =
      MakeGarbageCollected<HeapMap<LinkedNode, std::string>>();
  for (int id = 0; id < 10; id++) {
    auto t = MakeGarbageCollected<LinkedNode>(nullptr, id);
    p->insert(t, "122");
  }
}